

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O1

exr_result_t save_m33f(exr_context_t ctxt,exr_attribute_t *a)

{
  exr_attr_m33f_t *peVar1;
  exr_result_t eVar2;
  int32_t isz;
  exr_attr_m33f_t tmp;
  undefined4 local_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  float local_18;
  
  peVar1 = (a->field_6).m33f;
  local_18 = peVar1->m[8];
  local_38 = peVar1->m[0];
  fStack_34 = peVar1->m[1];
  fStack_30 = peVar1->m[2];
  fStack_2c = peVar1->m[3];
  local_28 = peVar1->m[4];
  fStack_24 = peVar1->m[5];
  fStack_20 = peVar1->m[6];
  fStack_1c = peVar1->m[7];
  local_3c = 0x24;
  eVar2 = (*ctxt->do_write)(ctxt,&local_3c,4,&ctxt->output_file_offset);
  if (eVar2 == 0) {
    eVar2 = (*ctxt->do_write)(ctxt,&local_38,0x24,&ctxt->output_file_offset);
  }
  return eVar2;
}

Assistant:

static exr_result_t
save_m33f (exr_context_t ctxt, const exr_attribute_t* a)
{
    exr_result_t    rv;
    exr_attr_m33f_t tmp = *(a->m33f);

    rv = save_attr_sz (ctxt, sizeof (exr_attr_m33f_t));
    if (rv == EXR_ERR_SUCCESS) rv = save_attr_32 (ctxt, &tmp, 9);
    return rv;
}